

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::processHexWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  char local_29;
  
  iVar2 = (int)word->_M_string_length;
  if (iVar2 < 3) {
    pcVar5 = (word->_M_dataplus)._M_p;
    iVar1 = isxdigit((int)*pcVar5);
    if ((iVar1 != 0) && ((iVar2 != 2 || (iVar2 = isxdigit((int)pcVar5[1]), iVar2 != 0)))) {
      lVar4 = strtol(pcVar5,(char **)0x0,0x10);
      local_29 = (char)lVar4;
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar5 = "Invalid character in hexadecimal number.";
    lVar4 = 0x28;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," at token: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar5 = "Size of hexadecimal number is too large.  Max is ff.";
    lVar4 = 0x34;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processHexWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Size of hexadecimal number is too large.  Max is ff." << std::endl;
		return 0;
	}

	if (!isxdigit(word[0]) || (length == 2 && !isxdigit(word[1]))) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "Invalid character in hexadecimal number." << std::endl;
		return 0;
	}

	outputByte = (uchar)strtol(word.c_str(), (char**)NULL, 16);
	out << outputByte;
	return 1;
}